

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_che.c
# Opt level: O1

void beltCHEStepE(void *buf,size_t count,void *state)

{
  ulong count_00;
  long lVar1;
  void *src;
  
  count_00 = *(ulong *)((long)state + 0x98);
  if (count_00 != 0) {
    src = (void *)((long)state + (0x90 - count_00));
    if (count <= count_00) {
      memXor2(buf,src,count);
      lVar1 = *(long *)((long)state + 0x98);
      goto LAB_00128d0a;
    }
    memXor2(buf,src,count_00);
    count = count - *(long *)((long)state + 0x98);
    buf = (void *)((long)buf + *(long *)((long)state + 0x98));
    *(undefined8 *)((long)state + 0x98) = 0;
  }
  if (0xf < count) {
    do {
      beltBlockMulC((u32 *)((long)state + 0x20));
      *(byte *)((long)state + 0x20) = *(byte *)((long)state + 0x20) ^ 1;
      *(undefined8 *)((long)state + 0x80) = *(undefined8 *)((long)state + 0x20);
      *(undefined8 *)((long)state + 0x88) = *(undefined8 *)((long)state + 0x28);
      beltBlockEncr2((u32 *)((long)state + 0x80),(u32 *)state);
      *(ulong *)buf = *buf ^ *(ulong *)((long)state + 0x80);
      *(ulong *)((long)buf + 8) = *(ulong *)((long)buf + 8) ^ *(ulong *)((long)state + 0x88);
      buf = (void *)((long)buf + 0x10);
      count = count - 0x10;
    } while (0xf < count);
  }
  if (count == 0) {
    return;
  }
  beltBlockMulC((u32 *)((long)state + 0x20));
  *(byte *)((long)state + 0x20) = *(byte *)((long)state + 0x20) ^ 1;
  *(undefined8 *)((long)state + 0x80) = *(undefined8 *)((long)state + 0x20);
  *(undefined8 *)((long)state + 0x88) = *(undefined8 *)((long)state + 0x28);
  beltBlockEncr2((u32 *)((long)state + 0x80),(u32 *)state);
  memXor2(buf,(u32 *)((long)state + 0x80),count);
  lVar1 = 0x10;
LAB_00128d0a:
  *(size_t *)((long)state + 0x98) = lVar1 - count;
  return;
}

Assistant:

void beltCHEStepE(void* buf, size_t count, void* state)
{
	belt_che_st* st = (belt_che_st*)state;
	ASSERT(memIsDisjoint2(buf, count, state, beltCHE_keep()));
	// есть резерв гаммы?
	if (st->reserved)
	{
		if (st->reserved >= count)
		{
			memXor2(buf, st->block1 + 16 - st->reserved, count);
			st->reserved -= count;
			return;
		}
		memXor2(buf, st->block1 + 16 - st->reserved, st->reserved);
		count -= st->reserved;
		buf = (octet*)buf + st->reserved;
		st->reserved = 0;
	}
	// цикл по полным блокам
	while (count >= 16)
	{
		beltBlockMulC(st->s), st->s[0] ^= 0x00000001;
		beltBlockCopy(st->block1, st->s);
		beltBlockEncr2((u32*)st->block1, st->key);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block1);
#endif
		beltBlockXor2(buf, st->block1);
		buf = (octet*)buf + 16;
		count -= 16;
	}
	// неполный блок?
	if (count)
	{
		beltBlockMulC(st->s), st->s[0] ^= 0x00000001;
		beltBlockCopy(st->block1, st->s);
		beltBlockEncr2((u32*)st->block1, st->key);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block1);
#endif
		memXor2(buf, st->block1, count);
		st->reserved = 16 - count;
	}
}